

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *
pstore::dump::string::write_unquoted<std::wostream>
          (basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os,string *v)

{
  char cVar1;
  long *plVar2;
  undefined4 uVar3;
  undefined8 in_RAX;
  char *pcVar4;
  char *pcVar6;
  undefined8 local_38;
  size_type sVar5;
  
  sVar5 = v->_M_string_length;
  if (sVar5 != 0) {
    pcVar6 = (v->_M_dataplus)._M_p;
    local_38 = in_RAX;
    if ((byte)(*pcVar6 - 0x21U) < 2) {
      std::operator<<(os,"\\");
      sVar5 = v->_M_string_length;
      if (sVar5 == 0) {
        return os;
      }
      pcVar6 = (v->_M_dataplus)._M_p;
    }
    pcVar4 = pcVar6 + sVar5;
    do {
      cVar1 = *pcVar6;
      if (cVar1 == '\\') {
        plVar2 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
        if (plVar2 == (long *)0x0) goto LAB_001286fd;
        uVar3 = (**(code **)(*plVar2 + 0x50))(plVar2,0x5c);
        local_38 = CONCAT44(local_38._4_4_,uVar3);
        std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,(wchar_t *)&local_38,1);
      }
      plVar2 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
      if (plVar2 == (long *)0x0) {
LAB_001286fd:
        std::__throw_bad_cast();
      }
      uVar3 = (**(code **)(*plVar2 + 0x50))(plVar2,(int)cVar1);
      local_38 = CONCAT44(uVar3,(wchar_t)local_38);
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                (os,(wchar_t *)((long)&local_38 + 4),1);
      pcVar6 = pcVar6 + 1;
    } while (pcVar6 != pcVar4);
  }
  return os;
}

Assistant:

OStream & string::write_unquoted (OStream & os, std::string const & v) {
            // If the string starts with backslash or bang, prefix with a backslash
            if (v.length () > 0) {
                auto const front = v.front ();
                if (front == '\"' || front == '!') {
                    os << "\\";
                }
            }
            // Emit the characters; a backslash is escaped.
            for (char ch : v) {
                if (ch == '\\') {
                    os << '\\';
                }
                os << ch;
            }
            return os;
        }